

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O0

RK_S32 parse_ptl(HEVCContext *s,PTL *ptl,int max_num_sub_layers)

{
  MPP_RET MVar1;
  RK_S32 local_48;
  RK_S32 local_44;
  RK_S32 _out_3;
  RK_S32 _out_2;
  RK_S32 _out_1;
  RK_S32 _out;
  BitReadCtx_t *gb;
  HEVCLocalContext *lc;
  RK_S32 i;
  int max_num_sub_layers_local;
  PTL *ptl_local;
  HEVCContext *s_local;
  
  __out_1 = &s->HEVClc->gb;
  gb = __out_1;
  lc._4_4_ = max_num_sub_layers;
  _i = ptl;
  ptl_local = (PTL *)s;
  decode_profile_tier_level(s,&ptl->general_ptl);
  MVar1 = mpp_read_bits(__out_1,8,&_out_2);
  __out_1->ret = MVar1;
  if (__out_1->ret == MPP_OK) {
    (_i->general_ptl).level_idc = (RK_U8)_out_2;
    for (lc._0_4_ = 0; (int)lc < lc._4_4_ + -1; lc._0_4_ = (int)lc + 1) {
      MVar1 = mpp_read_bits(__out_1,1,&_out_3);
      __out_1->ret = MVar1;
      if (__out_1->ret != MPP_OK) goto LAB_001defdc;
      _i->sub_layer_profile_present_flag[(int)lc] = (RK_U8)_out_3;
      MVar1 = mpp_read_bits(__out_1,1,&local_44);
      __out_1->ret = MVar1;
      if (__out_1->ret != MPP_OK) goto LAB_001defdc;
      _i->sub_layer_level_present_flag[(int)lc] = (RK_U8)local_44;
    }
    if (0 < lc._4_4_ + -1) {
      for (lc._0_4_ = lc._4_4_ + -1; (int)lc < 8; lc._0_4_ = (int)lc + 1) {
        MVar1 = mpp_skip_longbits(__out_1,2);
        __out_1->ret = MVar1;
        if (__out_1->ret != MPP_OK) goto LAB_001defdc;
      }
    }
    for (lc._0_4_ = 0; (int)lc < lc._4_4_ + -1; lc._0_4_ = (int)lc + 1) {
      if (_i->sub_layer_profile_present_flag[(int)lc] != '\0') {
        decode_profile_tier_level((HEVCContext *)ptl_local,_i->sub_layer_ptl + (int)lc);
      }
      if (_i->sub_layer_level_present_flag[(int)lc] != '\0') {
        MVar1 = mpp_read_bits(__out_1,8,&local_48);
        __out_1->ret = MVar1;
        if (__out_1->ret != MPP_OK) goto LAB_001defdc;
        _i->sub_layer_ptl[(int)lc].level_idc = (RK_U8)local_48;
      }
    }
    s_local._4_4_ = 0;
  }
  else {
LAB_001defdc:
    s_local._4_4_ = -0x3ec;
  }
  return s_local._4_4_;
}

Assistant:

static RK_S32 parse_ptl(HEVCContext *s, PTL *ptl, int max_num_sub_layers)
{
    RK_S32 i;
    HEVCLocalContext *lc = s->HEVClc;
    BitReadCtx_t *gb = &lc->gb;

    decode_profile_tier_level(s, &ptl->general_ptl);
    READ_BITS(gb, 8, &ptl->general_ptl.level_idc);

    for (i = 0; i < max_num_sub_layers - 1; i++) {
        READ_ONEBIT(gb, &ptl->sub_layer_profile_present_flag[i]);
        READ_ONEBIT(gb, &ptl->sub_layer_level_present_flag[i]);
    }
    if (max_num_sub_layers - 1 > 0)
        for (i = max_num_sub_layers - 1; i < 8; i++)
            SKIP_BITS(gb, 2); // reserved_zero_2bits[i]
    for (i = 0; i < max_num_sub_layers - 1; i++) {
        if (ptl->sub_layer_profile_present_flag[i])
            decode_profile_tier_level(s, &ptl->sub_layer_ptl[i]);
        if (ptl->sub_layer_level_present_flag[i])
            READ_BITS(gb, 8, &ptl->sub_layer_ptl[i].level_idc);
    }

    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}